

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_tests.cpp
# Opt level: O0

int __thiscall TestFixtureLikeVCUnit::c(TestFixtureLikeVCUnit *this,void *param_1,void *param_2)

{
  bool bVar1;
  char *message;
  uint local_20c;
  AssertionHelper local_208;
  Fixed local_1c8;
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  TestFixtureLikeVCUnit *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_3c = 2;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_38,"2","x",&local_3c,&x);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1c8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1c8);
    message = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/fixture_tests.cpp"
               ,0x69,message,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1c8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1c8);
  }
  local_20c = (uint)!bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (local_20c == 0) {
    local_20c = x + 1;
    x = local_20c;
  }
  return local_20c;
}

Assistant:

IUTEST_METHOD_CLEANUP(c)
    {
        IUTEST_ASSERT_EQ(2, x);
        ++x;
    }